

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task_impl.cpp
# Opt level: O1

MPP_RET mpp_task_queue_setup(MppTaskQueue queue,RK_S32 task_count)

{
  MppMeta *ppvVar1;
  pthread_mutex_t *__mutex;
  long *plVar2;
  void *pvVar3;
  MPP_RET MVar4;
  ulong uVar5;
  MppMeta *meta;
  
  __mutex = *(pthread_mutex_t **)((long)queue + 0x28);
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  if (*(long *)((long)queue + 0x48) != 0) {
    _mpp_log_l(2,"mpp_task_impl","Assertion %s failed at %s:%d\n",(char *)0x0,
               "impl->tasks == __null","mpp_task_queue_setup",0x1d7);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0015ff09;
  }
  if (*(int *)((long)queue + 0x30) != 0) {
    _mpp_log_l(2,"mpp_task_impl","Assertion %s failed at %s:%d\n",(char *)0x0,
               "impl->task_count == 0","mpp_task_queue_setup",0x1d8);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0015ff09:
      abort();
    }
  }
  pvVar3 = mpp_osal_calloc("mpp_task_queue_setup",(long)task_count * 0x30);
  if (pvVar3 == (void *)0x0) {
    _mpp_log_l(2,"mpp_task_impl","malloc tasks list failed\n","mpp_task_queue_setup");
    MVar4 = MPP_ERR_MALLOC;
  }
  else {
    *(void **)((long)queue + 0x48) = pvVar3;
    *(RK_S32 *)((long)queue + 0x30) = task_count;
    if (0 < task_count) {
      meta = (MppMeta *)((long)pvVar3 + 0x28);
      uVar5 = 0;
      do {
        meta[-5] = "mpp_task_impl";
        ppvVar1 = meta + -4;
        meta[-4] = ppvVar1;
        meta[-3] = ppvVar1;
        *(int *)(meta + -1) = (int)uVar5;
        meta[-2] = queue;
        *(undefined4 *)((long)meta + -4) = 0;
        mpp_meta_get_with_tag(meta,"mpp_task_impl","mpp_task_queue_setup");
        plVar2 = *(long **)((long)queue + 0x58);
        *(MppMeta **)((long)queue + 0x58) = ppvVar1;
        meta[-4] = (MppMeta)((long)queue + 0x50);
        meta[-3] = plVar2;
        *plVar2 = (long)ppvVar1;
        *(int *)((long)queue + 0x60) = *(int *)((long)queue + 0x60) + 1;
        uVar5 = uVar5 + 1;
        meta = meta + 6;
      } while ((uint)task_count != uVar5);
    }
    *(undefined4 *)((long)queue + 0x34) = 1;
    MVar4 = MPP_OK;
  }
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return MVar4;
}

Assistant:

MPP_RET mpp_task_queue_setup(MppTaskQueue queue, RK_S32 task_count)
{
    MppTaskQueueImpl *impl = (MppTaskQueueImpl *)queue;
    AutoMutex auto_lock(impl->lock);

    // NOTE: queue can only be setup once
    mpp_assert(impl->tasks == NULL);
    mpp_assert(impl->task_count == 0);
    MppTaskImpl *tasks = mpp_calloc(MppTaskImpl, task_count);
    if (NULL == tasks) {
        mpp_err_f("malloc tasks list failed\n");
        return MPP_ERR_MALLOC;
    }

    impl->tasks = tasks;
    impl->task_count = task_count;

    MppTaskStatusInfo *info = &impl->info[MPP_INPUT_PORT];

    for (RK_S32 i = 0; i < task_count; i++) {
        setup_mpp_task_name(&tasks[i]);
        INIT_LIST_HEAD(&tasks[i].list);
        tasks[i].index  = i;
        tasks[i].queue  = queue;
        tasks[i].status = MPP_INPUT_PORT;
        mpp_meta_get(&tasks[i].meta);

        list_add_tail(&tasks[i].list, &info->list);
        info->count++;
    }
    impl->ready = 1;
    return MPP_OK;
}